

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

void VW::read_line_json<true>
               (vw *all,v_array<example_*> *examples,char *line,example_factory_t example_factory,
               void *ex_factory_context)

{
  GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this;
  example *peVar1;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  char *pcVar5;
  vw_exception *this_00;
  ParseResult PVar6;
  InsituStringStream ss;
  stringstream __msg;
  char *local_210;
  long local_208;
  char local_200 [16];
  string local_1f0;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  local_1d0.dst_ = (Ch *)0x0;
  this = (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
         (all->p->jsonp).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1d0.src_ = line;
  local_1d0.head_ = line;
  sVar3 = strlen(line);
  *(vw **)(this + 0x48) = all;
  *(char **)(this + 0x50) = " ";
  *(undefined4 *)(this + 0x58) = 1;
  *(undefined8 *)(this + 0x68) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(undefined2 *)(this + 0x100) = 0;
  *(v_array<example_*> **)(this + 0x88) = examples;
  peVar1 = *examples->_begin;
  *(example **)(this + 0x90) = peVar1;
  (*(all->p->lp).default_label)(&peVar1->l);
  *(GenericInsituStringStream<rapidjson::UTF8<char>_> **)(this + 0x98) = &local_1d0;
  *(char **)(this + 0xa0) = line + sVar3;
  *(example_factory_t *)(this + 0xa8) = example_factory;
  *(void **)(this + 0xb0) = ex_factory_context;
  PVar6 = rapidjson::
          GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    (this,&local_1d0,(VWReaderHandler<true> *)(this + 0x40));
  if (PVar6.code_ == kParseErrorNone) {
    return;
  }
  lVar2 = *(long *)(this + 0x60);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"JSON parser error at ",0x15);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  pcVar5 = rapidjson::GetParseError_En(PVar6.code_);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,". Handler: ",0xb);
  Context<true>::error_abi_cxx11_((Context<true> *)(this + 0x40));
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_210,local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"State: ",7);
  if (lVar2 == 0) {
    pcVar5 = "null";
  }
  else {
    pcVar5 = *(char **)(lVar2 + 8);
  }
  std::operator<<(poVar4,pcVar5);
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_example_json.h"
             ,0x474,&local_1f0);
  __cxa_throw(this_00,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void read_line_json(
    vw& all, v_array<example*>& examples, char* line, example_factory_t example_factory, void* ex_factory_context)
{
  // string line_copy(line);
  // destructive parsing
  InsituStringStream ss(line);
  json_parser<audit>* parser = static_cast<json_parser<audit>*>(all.p->jsonp.get());

  VWReaderHandler<audit>& handler = parser->handler;
  handler.init(&all, &examples, &ss, line + strlen(line), example_factory, ex_factory_context);

  ParseResult result =
      parser->reader.template Parse<kParseInsituFlag, InsituStringStream, VWReaderHandler<audit>>(ss, handler);
  if (!result.IsError())
    return;

  BaseState<audit>* current_state = handler.current_state();

  THROW("JSON parser error at " << result.Offset() << ": " << GetParseError_En(result.Code())
                                << ". "
                                   "Handler: "
                                << handler.error().str()
                                << "State: " << (current_state ? current_state->name : "null"));  // <<
  // "Line: '"<< line_copy << "'");
}